

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostl.c
# Opt level: O1

int trico_read_stl_full(uint32_t *nr_of_vertices,float **vertices,uint32_t *nr_of_triangles,
                       uint32_t **triangles,float **normals,uint16_t **attributes,char *filename)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  uint32_t *puVar3;
  float *pfVar4;
  uint16_t *puVar5;
  float *pfVar6;
  size_t __size;
  long lVar7;
  uint32_t uVar8;
  long lVar9;
  char buffer [80];
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  uint16_t local_58;
  
  iVar2 = 0;
  *vertices = (float *)0x0;
  *triangles = (uint32_t *)0x0;
  *nr_of_vertices = 0;
  *nr_of_triangles = 0;
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    fread(&local_88,1,0x50,__stream);
    if (((((char)local_88 == 's') && (local_88._1_1_ == 'o')) && (local_88._2_1_ == 'l')) &&
       ((local_88._3_1_ == 'i' && ((char)local_84 == 'd')))) {
      fclose(__stream);
      iVar2 = 0;
    }
    else {
      fread(nr_of_triangles,4,1,__stream);
      uVar1 = *nr_of_triangles;
      __size = (ulong)(uVar1 * 3) << 2;
      puVar3 = (uint32_t *)malloc(__size);
      *triangles = puVar3;
      pfVar4 = (float *)malloc(__size);
      *normals = pfVar4;
      puVar5 = (uint16_t *)malloc((ulong)uVar1 * 2);
      *attributes = puVar5;
      *nr_of_vertices = 0;
      pfVar6 = (float *)malloc((ulong)(*nr_of_triangles * 9) << 2);
      *vertices = pfVar6;
      puVar3 = *triangles;
      pfVar4 = *normals;
      puVar5 = *attributes;
      iVar2 = feof(__stream);
      uVar8 = 0;
      if (iVar2 == 0) {
        lVar7 = 0;
        lVar9 = 0;
        do {
          if (*nr_of_triangles <= (uint)lVar9) break;
          fread(&local_88,1,0x32,__stream);
          *(undefined4 *)((long)pfVar4 + lVar7) = local_88;
          *(undefined4 *)((long)pfVar4 + lVar7 + 4) = local_84;
          *(undefined4 *)((long)pfVar4 + lVar7 + 8) = local_80;
          *pfVar6 = local_7c;
          pfVar6[1] = local_78;
          pfVar6[2] = local_74;
          pfVar6[3] = local_70;
          pfVar6[4] = local_6c;
          pfVar6[5] = local_68;
          pfVar6[6] = local_64;
          pfVar6[7] = local_60;
          pfVar6[8] = local_5c;
          puVar5[lVar9] = local_58;
          uVar8 = *nr_of_vertices;
          *nr_of_vertices = uVar8 + 1;
          *(uint32_t *)((long)puVar3 + lVar7) = uVar8;
          uVar8 = *nr_of_vertices;
          *nr_of_vertices = uVar8 + 1;
          *(uint32_t *)((long)puVar3 + lVar7 + 4) = uVar8;
          uVar8 = *nr_of_vertices;
          *nr_of_vertices = uVar8 + 1;
          *(uint32_t *)((long)puVar3 + lVar7 + 8) = uVar8;
          iVar2 = feof(__stream);
          lVar9 = lVar9 + 1;
          lVar7 = lVar7 + 0xc;
          pfVar6 = pfVar6 + 9;
        } while (iVar2 == 0);
        uVar8 = (uint32_t)lVar9;
      }
      fclose(__stream);
      iVar2 = 0;
      if (uVar8 == *nr_of_triangles) {
        trico_remove_duplicate_vertices(nr_of_vertices,vertices,*nr_of_triangles,triangles);
        pfVar4 = (float *)realloc(*vertices,(ulong)(*nr_of_vertices * 3) << 2);
        *vertices = pfVar4;
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int trico_read_stl_full(uint32_t* nr_of_vertices, float** vertices, uint32_t* nr_of_triangles, uint32_t** triangles, float** normals, uint16_t** attributes, const char* filename)
  {
  *vertices = NULL;
  *triangles = NULL;
  *nr_of_vertices = 0;
  *nr_of_triangles = 0;
  FILE* inputfile = fopen(filename, "rb");
  if (!inputfile)
    return 0;

  if (!inputfile)
    return 0;

  char buffer[80];
  fread(buffer, 1, 80, inputfile);

  if (buffer[0] == 's' && buffer[1] == 'o' && buffer[2] == 'l' && buffer[3] == 'i' && buffer[4] == 'd')
    {
    fclose(inputfile);
    return 0;
    }

  fread((void*)(nr_of_triangles), sizeof(uint32_t), 1, inputfile);
  *triangles = (uint32_t*)trico_malloc(*nr_of_triangles * 3 * sizeof(uint32_t));
  *normals = (float*)trico_malloc(*nr_of_triangles * 3 * sizeof(float));
  *attributes = (uint16_t*)trico_malloc(*nr_of_triangles * sizeof(uint16_t));
  uint32_t count_triangles = 0;
  *nr_of_vertices = 0;
  *vertices = (float*)trico_malloc(*nr_of_triangles * 9 * sizeof(float));

  uint32_t* tria_it = *triangles;
  float* vert_it = *vertices;
  float* norm_it = *normals;
  uint16_t* attr_it = *attributes;
  while (!feof(inputfile) && count_triangles < *nr_of_triangles)
    {
    ++count_triangles;
    fread(buffer, 1, 50, inputfile);
    *norm_it++ = *(float*)(&(buffer[0]));
    *norm_it++ = *(float*)(&(buffer[4]));
    *norm_it++ = *(float*)(&(buffer[8]));
    *vert_it++ = *(float*)(&(buffer[12]));
    *vert_it++ = *(float*)(&(buffer[16]));
    *vert_it++ = *(float*)(&(buffer[20]));
    *vert_it++ = *(float*)(&(buffer[24]));
    *vert_it++ = *(float*)(&(buffer[28]));
    *vert_it++ = *(float*)(&(buffer[32]));
    *vert_it++ = *(float*)(&(buffer[36]));
    *vert_it++ = *(float*)(&(buffer[40]));
    *vert_it++ = *(float*)(&(buffer[44]));
    *attr_it++ = *(uint16_t*)(&(buffer[48]));
    *tria_it++ = (*nr_of_vertices)++;
    *tria_it++ = (*nr_of_vertices)++;
    *tria_it++ = (*nr_of_vertices)++;
    }
  fclose(inputfile);
  if (count_triangles != *nr_of_triangles)
    return 0;

  trico_remove_duplicate_vertices(nr_of_vertices, vertices, *nr_of_triangles, triangles);
  *vertices = (float*)trico_realloc(*vertices, *nr_of_vertices * 3 * sizeof(float));
  return 1;
  }